

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::IsnanCaseInstance::getInputValues
          (IsnanCaseInstance *this,int numValues,void **values)

{
  pointer pSVar1;
  deUint32 dVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  Random rnd;
  deRandom local_40;
  
  dVar2 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar2 ^ 0xc2a39f);
  pSVar1 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)((long)&(pSVar1->varType).m_data + 4);
  iVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  uVar6 = (0x3fffffU >> (0x17 - (&DAT_00b2c45c)[(ulong)uVar6 * 4] & 0x1f)) <<
          (0x17 - (&DAT_00b2c45c)[(ulong)uVar6 * 4] & 0x1f);
  if (0 < iVar3 * numValues) {
    uVar4 = 0;
    do {
      fVar8 = deRandom_getFloat(&local_40);
      if (fVar8 <= 0.3) {
        fVar8 = deRandom_getFloat(&local_40);
        if (fVar8 <= 0.4) {
          dVar2 = deRandom_getUint32(&local_40);
          uVar5 = dVar2 & uVar6 | 0x400000;
          dVar2 = deRandom_getUint32(&local_40);
          uVar7 = (dVar2 & 0x7f) << 0x17;
        }
        else {
          uVar7 = 0x7f800000;
          uVar5 = 0;
        }
      }
      else {
        dVar2 = deRandom_getUint32(&local_40);
        uVar5 = dVar2 & uVar6 | 0x400000;
        uVar7 = 0x7f800000;
      }
      dVar2 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)*values + uVar4 * 4) = dVar2 << 0x1f | uVar7 | uVar5;
      uVar4 = uVar4 + 1;
    } while ((uint)(iVar3 * numValues) != uVar4);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(m_name) ^ 0xc2a39fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			mantissaMask	= ~getMaxUlpDiffFromBits(mantissaBits) & ((1u<<23)-1u);

		for (int valNdx = 0; valNdx < numValues*scalarSize; valNdx++)
		{
			const bool		isNan		= rnd.getFloat() > 0.3f;
			const bool		isInf		= !isNan && rnd.getFloat() > 0.4f;
			const deUint32	mantissa	= !isInf ? ((1u<<22) | (rnd.getUint32() & mantissaMask)) : 0;
			const deUint32	exp			= !isNan && !isInf ? (rnd.getUint32() & 0x7fu) : 0xffu;
			const deUint32	sign		= rnd.getUint32() & 0x1u;
			const deUint32	value		= (sign << 31) | (exp << 23) | mantissa;

			DE_ASSERT(tcu::Float32(value).isInf() == isInf && tcu::Float32(value).isNaN() == isNan);

			((deUint32*)values[0])[valNdx] = value;
		}
	}